

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistent_cohomology.h
# Opt level: O2

void __thiscall
Gudhi::persistent_cohomology::
Persistent_cohomology<Gudhi::Simplex_tree<MiniSTOptions>,_Gudhi::persistent_cohomology::Field_Zp>::
~Persistent_cohomology
          (Persistent_cohomology<Gudhi::Simplex_tree<MiniSTOptions>,_Gudhi::persistent_cohomology::Field_Zp>
           *this)

{
  _Base_ptr this_00;
  _Base_ptr p_Var1;
  
  for (p_Var1 = (this->transverse_idx_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->transverse_idx_)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    boost::intrusive::
    list_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_char,int>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)2,Gudhi::persistent_cohomology::cam_h_tag,1u>,unsigned_long,false,void>
    ::
    clear_and_dispose<Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<MiniSTOptions>,Gudhi::persistent_cohomology::Field_Zp>::~Persistent_cohomology()::_lambda(Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_char,int>*)_1_>
              ((list_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_char,int>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)2,Gudhi::persistent_cohomology::cam_h_tag,1u>,unsigned_long,false,void>
                *)p_Var1[1]._M_parent);
    this_00 = p_Var1[1]._M_parent;
    if (this_00 != (_Base_ptr)0x0) {
      boost::intrusive::
      list_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_char,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)2,_Gudhi::persistent_cohomology::cam_h_tag,_1U>,_unsigned_long,_false,_void>
      ::~list_impl((list_impl<boost::intrusive::bhtraits<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_char,_int>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)2,_Gudhi::persistent_cohomology::cam_h_tag,_1U>,_unsigned_long,_false,_void>
                    *)this_00);
    }
    operator_delete(this_00,0x10);
  }
  boost::pool<boost::default_user_allocator_malloc_free>::~pool
            (&(this->cell_pool_).super_pool<boost::default_user_allocator_malloc_free>);
  boost::pool<boost::default_user_allocator_malloc_free>::~pool
            (&(this->column_pool_).super_pool<boost::default_user_allocator_malloc_free>);
  std::
  _Vector_base<std::tuple<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_true>,_boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_true>,_int>,_std::allocator<std::tuple<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_true>,_boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_true>,_int>_>_>
  ::~_Vector_base(&(this->persistent_pairs_).
                   super__Vector_base<std::tuple<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_true>,_boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_true>,_int>,_std::allocator<std::tuple<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_true>,_boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_true>,_int>_>_>
                 );
  std::
  _Rb_tree<unsigned_char,_std::pair<const_unsigned_char,_Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<MiniSTOptions>,_Gudhi::persistent_cohomology::Field_Zp>::cocycle>,_std::_Select1st<std::pair<const_unsigned_char,_Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<MiniSTOptions>,_Gudhi::persistent_cohomology::Field_Zp>::cocycle>_>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<MiniSTOptions>,_Gudhi::persistent_cohomology::Field_Zp>::cocycle>_>_>
  ::~_Rb_tree(&(this->transverse_idx_)._M_t);
  std::
  _Hashtable<unsigned_char,_std::pair<const_unsigned_char,_unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->zero_cocycles_)._M_h);
  std::
  _Vector_base<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_char,_int>_*,_std::allocator<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_char,_int>_*>_>
  ::~_Vector_base(&(this->ds_repr_).
                   super__Vector_base<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_char,_int>_*,_std::allocator<Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_char,_int>_*>_>
                 );
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&(this->ds_parent_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->ds_rank_).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->coeff_field_).inverse_.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

~Persistent_cohomology() {
    // Clean the transversal lists
    for (auto & transverse_ref : transverse_idx_) {
      // Destruct all the cells
      transverse_ref.second.row_->clear_and_dispose([&](Cell*p){p->~Cell();});
      delete transverse_ref.second.row_;
    }
  }